

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall Transaction_GetRwUInt64_Test::TestBody(Transaction_GetRwUInt64_Test *this)

{
  mock_database *db;
  char *message;
  shared_ptr<unsigned_long> ptr;
  mock_mutex mutex;
  uint64_t expected;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_80 [8];
  bool local_78;
  undefined7 uStack_77;
  AssertHelper local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  _Head_base<0UL,_pstore::region::factory_*,_false> local_58;
  file_base *local_28;
  uint64_t uStack_20;
  
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10000000000;
  local_28 = (file_base *)0x0;
  uStack_20 = 0;
  db = &(this->super_Transaction).db_;
  local_80 = (undefined1  [8])&local_70;
  local_78 = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_80);
  local_78 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_60,&db->super_database,
             (unique_lock<mock_mutex> *)local_80);
  local_28 = (file_base *)pstore::transaction_base::allocate((transaction_base *)local_60,8,8);
  uStack_20 = 8;
  pstore::database::getrw<unsigned_long,void>
            ((database *)local_80,(extent<unsigned_long> *)local_58._M_head_impl);
  *(AssertHelperData **)local_80 = (AssertHelperData *)0x10000000000;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_77,local_78) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_77,local_78));
  }
  pstore::transaction_base::commit((transaction_base *)local_60);
  local_60 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_60);
  pstore::database::getro<unsigned_long,void>((database *)local_80,(extent<unsigned_long> *)db);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_60,"expected","*db_.getro (extent)",(unsigned_long *)&local_68,
             (unsigned_long *)local_80);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_77,local_78) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_77,local_78));
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_58._M_head_impl == (factory *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1e5,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_80 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (*(code *)(*(AssertHelperData **)local_80)->file)();
    }
  }
  if ((_Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
      local_58._M_head_impl != (factory *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (Transaction, GetRwUInt64) {
    std::uint64_t const expected = 1ULL << 40;
    pstore::extent<std::uint64_t> extent;
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            // Allocate the storage
            pstore::address const addr =
                transaction.allocate (sizeof (std::uint64_t), alignof (std::uint64_t));
            extent =
                make_extent (pstore::typed_address<std::uint64_t> (addr), sizeof (std::uint64_t));
            std::shared_ptr<std::uint64_t> ptr = transaction.getrw (extent);

            // Save the data to the store
            *(ptr) = expected;
        }
        transaction.commit ();
    }
    EXPECT_EQ (expected, *db_.getro (extent));
}